

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleDownloadCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *pcVar1;
  _Alloc_hider _Var2;
  _func_int **pp_Var3;
  bool bVar4;
  __type _Var5;
  bool bVar6;
  CURLcode CVar7;
  long lVar8;
  long lVar9;
  ostream *poVar10;
  CURL *curl;
  char *pcVar11;
  string *this_00;
  pointer pbVar12;
  _Alloc_hider _Var13;
  bool local_559;
  cmCryptoHash *local_558;
  cURLProgressHelper helper;
  long local_520;
  cURLEasyGuard g_curl;
  string actualHash_1;
  char *local_4e8;
  string err_1;
  string dir;
  cmFileCommandVectorOfChar chunkDebug;
  string file;
  string expectedHash;
  string statusVar;
  string logVar;
  string hashMatchMSG;
  string local_290;
  string local_270;
  ofstream fout;
  string url;
  
  pbVar12 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12) < 0x41) {
    std::__cxx11::string::string
              ((string *)&fout,"DOWNLOAD must be called with at least three arguments.",
               (allocator *)&err_1);
    cmCommand::SetError(&this->super_cmCommand,(string *)&fout);
    std::__cxx11::string::~string((string *)&fout);
    return false;
  }
  std::__cxx11::string::string((string *)&url,(string *)(pbVar12 + 1));
  std::__cxx11::string::string((string *)&file,(string *)(pbVar12 + 2));
  logVar._M_dataplus._M_p = (pointer)&logVar.field_2;
  logVar._M_string_length = 0;
  statusVar._M_dataplus._M_p = (pointer)&statusVar.field_2;
  statusVar._M_string_length = 0;
  logVar.field_2._M_local_buf[0] = '\0';
  statusVar.field_2._M_local_buf[0] = '\0';
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string((string *)&fout,"CMAKE_TLS_VERIFY",(allocator *)&err_1);
  local_559 = cmMakefile::IsOn(pcVar1,(string *)&fout);
  std::__cxx11::string::~string((string *)&fout);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string((string *)&fout,"CMAKE_TLS_CAINFO",(allocator *)&err_1);
  local_4e8 = cmMakefile::GetDefinition(pcVar1,(string *)&fout);
  std::__cxx11::string::~string((string *)&fout);
  expectedHash._M_dataplus._M_p = (pointer)&expectedHash.field_2;
  expectedHash._M_string_length = 0;
  expectedHash.field_2._M_local_buf[0] = '\0';
  hashMatchMSG._M_dataplus._M_p = (pointer)&hashMatchMSG.field_2;
  hashMatchMSG._M_string_length = 0;
  local_558 = (cmCryptoHash *)0x0;
  hashMatchMSG.field_2._M_local_buf[0] = '\0';
  bVar6 = false;
  local_520 = 0;
  lVar8 = 0;
  for (pbVar12 = pbVar12 + 3;
      pbVar12 !=
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish; pbVar12 = pbVar12 + 1) {
    bVar4 = std::operator==(pbVar12,"TIMEOUT");
    if (bVar4) {
      pbVar12 = pbVar12 + 1;
      if (pbVar12 ==
          (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string
                  ((string *)&fout,"DOWNLOAD missing time for TIMEOUT.",(allocator *)&err_1);
        cmCommand::SetError(&this->super_cmCommand,(string *)&fout);
        goto LAB_003a3aad;
      }
      lVar8 = atol((pbVar12->_M_dataplus)._M_p);
    }
    else {
      bVar4 = std::operator==(pbVar12,"INACTIVITY_TIMEOUT");
      if (bVar4) {
        pbVar12 = pbVar12 + 1;
        if (pbVar12 ==
            (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::string
                    ((string *)&fout,"DOWNLOAD missing time for INACTIVITY_TIMEOUT.",
                     (allocator *)&err_1);
          cmCommand::SetError(&this->super_cmCommand,(string *)&fout);
          goto LAB_003a3aad;
        }
        local_520 = atol((pbVar12->_M_dataplus)._M_p);
      }
      else {
        bVar4 = std::operator==(pbVar12,"LOG");
        if (bVar4) {
          pbVar12 = pbVar12 + 1;
          if (pbVar12 ==
              (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            std::__cxx11::string::string
                      ((string *)&fout,"DOWNLOAD missing VAR for LOG.",(allocator *)&err_1);
            cmCommand::SetError(&this->super_cmCommand,(string *)&fout);
            goto LAB_003a3aad;
          }
          std::__cxx11::string::_M_assign((string *)&logVar);
        }
        else {
          bVar4 = std::operator==(pbVar12,"STATUS");
          if (bVar4) {
            pbVar12 = pbVar12 + 1;
            if (pbVar12 ==
                (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              std::__cxx11::string::string
                        ((string *)&fout,"DOWNLOAD missing VAR for STATUS.",(allocator *)&err_1);
              cmCommand::SetError(&this->super_cmCommand,(string *)&fout);
              goto LAB_003a3aad;
            }
            std::__cxx11::string::_M_assign((string *)&statusVar);
          }
          else {
            bVar4 = std::operator==(pbVar12,"TLS_VERIFY");
            if (bVar4) {
              pbVar12 = pbVar12 + 1;
              if (pbVar12 ==
                  (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
                std::__cxx11::string::string
                          ((string *)&fout,"TLS_VERIFY missing bool value.",(allocator *)&err_1);
                cmCommand::SetError(&this->super_cmCommand,(string *)&fout);
                goto LAB_003a3aad;
              }
              local_559 = cmSystemTools::IsOn((pbVar12->_M_dataplus)._M_p);
            }
            else {
              bVar4 = std::operator==(pbVar12,"TLS_CAINFO");
              if (bVar4) {
                pbVar12 = pbVar12 + 1;
                if (pbVar12 ==
                    (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
                  std::__cxx11::string::string
                            ((string *)&fout,"TLS_CAFILE missing file value.",(allocator *)&err_1);
                  cmCommand::SetError(&this->super_cmCommand,(string *)&fout);
                  goto LAB_003a3aad;
                }
                local_4e8 = (pbVar12->_M_dataplus)._M_p;
              }
              else {
                bVar4 = std::operator==(pbVar12,"EXPECTED_MD5");
                if (bVar4) {
                  pbVar12 = pbVar12 + 1;
                  if (pbVar12 ==
                      (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
                    std::__cxx11::string::string
                              ((string *)&fout,"DOWNLOAD missing sum value for EXPECTED_MD5.",
                               (allocator *)&err_1);
                    cmCommand::SetError(&this->super_cmCommand,(string *)&fout);
                    goto LAB_003a3aad;
                  }
                  cmCryptoHash::New((cmCryptoHash *)&fout,"MD5");
                  pp_Var3 = fout.super_basic_ostream<char,_std::char_traits<char>_>.
                            _vptr_basic_ostream;
                  fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                       (_func_int **)0x0;
                  if (local_558 != (cmCryptoHash *)pp_Var3) {
                    if ((local_558 != (cmCryptoHash *)0x0) &&
                       ((*local_558->_vptr_cmCryptoHash[1])(),
                       fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                       != (_func_int **)0x0)) {
                      (**(code **)(*fout.super_basic_ostream<char,_std::char_traits<char>_>.
                                    _vptr_basic_ostream + 8))();
                    }
                    local_558 = (cmCryptoHash *)pp_Var3;
                  }
                  std::__cxx11::string::assign((char *)&hashMatchMSG);
                  cmsys::SystemTools::LowerCase((string *)&fout,pbVar12);
                  std::__cxx11::string::operator=((string *)&expectedHash,(string *)&fout);
                  std::__cxx11::string::~string((string *)&fout);
                }
                else {
                  bVar4 = std::operator==(pbVar12,"SHOW_PROGRESS");
                  if (bVar4) {
                    bVar6 = true;
                  }
                  else {
                    bVar4 = std::operator==(pbVar12,"EXPECTED_HASH");
                    if (bVar4) {
                      pbVar12 = pbVar12 + 1;
                      if (pbVar12 ==
                          (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish) {
                        std::__cxx11::string::string
                                  ((string *)&fout,"DOWNLOAD missing ALGO=value for EXPECTED_HASH.",
                                   (allocator *)&err_1);
                        cmCommand::SetError(&this->super_cmCommand,(string *)&fout);
                      }
                      else {
                        lVar9 = std::__cxx11::string::find((char *)pbVar12,0x550d37);
                        if (lVar9 != -1) {
                          std::__cxx11::string::substr((ulong)&fout,(ulong)pbVar12);
                          std::__cxx11::string::substr((ulong)&helper,(ulong)pbVar12);
                          cmsys::SystemTools::LowerCase(&err_1,(string *)&helper);
                          std::__cxx11::string::operator=((string *)&expectedHash,(string *)&err_1);
                          std::__cxx11::string::~string((string *)&err_1);
                          std::__cxx11::string::~string((string *)&helper);
                          cmCryptoHash::New((cmCryptoHash *)&err_1,
                                            (char *)fout.
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream);
                          _Var2 = err_1._M_dataplus;
                          err_1._M_dataplus._M_p = (pointer)0x0;
                          _Var13._M_p = (pointer)local_558;
                          if (((local_558 != (cmCryptoHash *)_Var2._M_p) &&
                              (_Var13 = _Var2, local_558 != (cmCryptoHash *)0x0)) &&
                             ((*local_558->_vptr_cmCryptoHash[1])(),
                             err_1._M_dataplus._M_p != (pointer)0x0)) {
                            (**(code **)(*(long *)err_1._M_dataplus._M_p + 8))();
                          }
                          if ((cmCryptoHash *)_Var13._M_p == (cmCryptoHash *)0x0) {
                            std::__cxx11::string::string
                                      ((string *)&err_1,
                                       "DOWNLOAD EXPECTED_HASH given unknown ALGO: ",
                                       (allocator *)&helper);
                            std::__cxx11::string::append((string *)&err_1);
                            cmCommand::SetError(&this->super_cmCommand,&err_1);
                          }
                          else {
                            std::operator+(&err_1,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&fout," hash");
                            std::__cxx11::string::operator=
                                      ((string *)&hashMatchMSG,(string *)&err_1);
                          }
                          std::__cxx11::string::~string((string *)&err_1);
                          std::__cxx11::string::~string((string *)&fout);
                          local_558 = (cmCryptoHash *)_Var13._M_p;
                          if ((cmCryptoHash *)_Var13._M_p != (cmCryptoHash *)0x0) goto LAB_003a34b4;
                          bVar6 = false;
                          goto LAB_003a3bc4;
                        }
                        std::__cxx11::string::string
                                  ((string *)&fout,
                                   "DOWNLOAD EXPECTED_HASH expects ALGO=value but got: ",
                                   (allocator *)&err_1);
                        std::__cxx11::string::append((string *)&fout);
                        cmCommand::SetError(&this->super_cmCommand,(string *)&fout);
                      }
LAB_003a3aad:
                      std::__cxx11::string::~string((string *)&fout);
                      bVar6 = false;
                      goto LAB_003a3bb4;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_003a34b4:
  }
  bVar4 = cmsys::SystemTools::FileExists(file._M_dataplus._M_p);
  if (bVar4 && local_558 != (cmCryptoHash *)0x0) {
    err_1._M_dataplus._M_p = (pointer)&err_1.field_2;
    err_1._M_string_length = 0;
    err_1.field_2._M_local_buf[0] = '\0';
    cmCryptoHash::HashFile((string *)&helper,local_558,&file);
    _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &helper,&expectedHash);
    if (!_Var5) {
      std::__cxx11::string::~string((string *)&helper);
      std::__cxx11::string::~string((string *)&err_1);
      goto LAB_003a3702;
    }
    std::__cxx11::string::assign((char *)&err_1);
    std::__cxx11::string::append((string *)&err_1);
    std::__cxx11::string::append((char *)&err_1);
    if (statusVar._M_string_length != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fout);
      poVar10 = (ostream *)std::ostream::operator<<(&fout,0);
      poVar10 = std::operator<<(poVar10,";\"");
      std::operator<<(poVar10,(string *)&err_1);
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::AddDefinition(pcVar1,&statusVar,dir._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&dir);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fout);
    }
    std::__cxx11::string::~string((string *)&helper);
    std::__cxx11::string::~string((string *)&err_1);
    bVar6 = true;
  }
  else {
LAB_003a3702:
    cmsys::SystemTools::GetFilenamePath(&dir,&file);
    bVar4 = cmsys::SystemTools::FileExists(dir._M_dataplus._M_p);
    if ((bVar4) || (bVar4 = cmsys::SystemTools::MakeDirectory(dir._M_dataplus._M_p), bVar4)) {
      std::ofstream::ofstream(&fout,file._M_dataplus._M_p,_S_bin);
      if (((&fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
           [(long)fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] &
          5) == 0) {
        curl_global_init(3);
        curl = curl_easy_init();
        if (curl == (CURL *)0x0) {
          std::__cxx11::string::string
                    ((string *)&err_1,"DOWNLOAD error initializing curl.",(allocator *)&helper);
          cmCommand::SetError(&this->super_cmCommand,&err_1);
          goto LAB_003a3795;
        }
        g_curl.Easy = curl;
        CVar7 = curl_easy_setopt(curl,CURLOPT_URL,url._M_dataplus._M_p);
        if (CVar7 == CURLE_OK) {
          CVar7 = curl_easy_setopt(curl,CURLOPT_FAILONERROR,1);
          if (CVar7 != CURLE_OK) {
            std::__cxx11::string::string
                      ((string *)&err_1,"DOWNLOAD cannot set http failure option: ",
                       (allocator *)&helper);
            curl_easy_strerror(CVar7);
            std::__cxx11::string::append((char *)&err_1);
            cmCommand::SetError(&this->super_cmCommand,&err_1);
            goto LAB_003a3b81;
          }
          CVar7 = curl_easy_setopt(curl,CURLOPT_USERAGENT,"curl/7.38.0");
          if (CVar7 != CURLE_OK) {
            std::__cxx11::string::string
                      ((string *)&err_1,"DOWNLOAD cannot set user agent option: ",
                       (allocator *)&helper);
            curl_easy_strerror(CVar7);
            std::__cxx11::string::append((char *)&err_1);
            cmCommand::SetError(&this->super_cmCommand,&err_1);
            goto LAB_003a3b81;
          }
          CVar7 = curl_easy_setopt(curl,CURLOPT_WRITEFUNCTION,
                                   anon_unknown.dwarf_660bbe::cmWriteToFileCallback);
          if (CVar7 != CURLE_OK) {
            std::__cxx11::string::string
                      ((string *)&err_1,"DOWNLOAD cannot set write function: ",(allocator *)&helper)
            ;
            curl_easy_strerror(CVar7);
            std::__cxx11::string::append((char *)&err_1);
            cmCommand::SetError(&this->super_cmCommand,&err_1);
            goto LAB_003a3b81;
          }
          CVar7 = curl_easy_setopt(curl,CURLOPT_DEBUGFUNCTION,
                                   anon_unknown.dwarf_660bbe::cmFileCommandCurlDebugCallback);
          if (CVar7 != CURLE_OK) {
            std::__cxx11::string::string
                      ((string *)&err_1,"DOWNLOAD cannot set debug function: ",(allocator *)&helper)
            ;
            curl_easy_strerror(CVar7);
            std::__cxx11::string::append((char *)&err_1);
            cmCommand::SetError(&this->super_cmCommand,&err_1);
            goto LAB_003a3b81;
          }
          if (local_559 == false) {
            CVar7 = curl_easy_setopt(curl,CURLOPT_SSL_VERIFYPEER,0);
            if (CVar7 == CURLE_OK) goto LAB_003a3d5c;
            std::__cxx11::string::string
                      ((string *)&err_1,"Unable to set TLS/SSL Verify off: ",(allocator *)&helper);
            curl_easy_strerror(CVar7);
            std::__cxx11::string::append((char *)&err_1);
            cmCommand::SetError(&this->super_cmCommand,&err_1);
            goto LAB_003a3b81;
          }
          CVar7 = curl_easy_setopt(curl,CURLOPT_SSL_VERIFYPEER,1);
          if (CVar7 != CURLE_OK) {
            std::__cxx11::string::string
                      ((string *)&err_1,"Unable to set TLS/SSL Verify on: ",(allocator *)&helper);
            curl_easy_strerror(CVar7);
            std::__cxx11::string::append((char *)&err_1);
            cmCommand::SetError(&this->super_cmCommand,&err_1);
            goto LAB_003a3b81;
          }
LAB_003a3d5c:
          cmCurlSetCAInfo_abi_cxx11_(&local_270,curl,local_4e8);
          if (local_270._M_string_length == 0) {
            chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            CVar7 = curl_easy_setopt(curl,CURLOPT_WRITEDATA,&fout);
            if (CVar7 == CURLE_OK) {
              CVar7 = curl_easy_setopt(curl,CURLOPT_DEBUGDATA,&chunkDebug);
              if (CVar7 != CURLE_OK) {
                std::__cxx11::string::string
                          ((string *)&err_1,"DOWNLOAD cannot set debug data: ",(allocator *)&helper)
                ;
                curl_easy_strerror(CVar7);
                std::__cxx11::string::append((char *)&err_1);
                cmCommand::SetError(&this->super_cmCommand,&err_1);
                goto LAB_003a3ec5;
              }
              CVar7 = curl_easy_setopt(curl,CURLOPT_FOLLOWLOCATION,1);
              if (CVar7 != CURLE_OK) {
                std::__cxx11::string::string
                          ((string *)&err_1,"DOWNLOAD cannot set follow-redirect option: ",
                           (allocator *)&helper);
                curl_easy_strerror(CVar7);
                std::__cxx11::string::append((char *)&err_1);
                cmCommand::SetError(&this->super_cmCommand,&err_1);
                goto LAB_003a3ec5;
              }
              if ((logVar._M_string_length != 0) &&
                 (CVar7 = curl_easy_setopt(curl,CURLOPT_VERBOSE,1), CVar7 != CURLE_OK)) {
                std::__cxx11::string::string
                          ((string *)&err_1,"DOWNLOAD cannot set verbose: ",(allocator *)&helper);
                curl_easy_strerror(CVar7);
                std::__cxx11::string::append((char *)&err_1);
                cmCommand::SetError(&this->super_cmCommand,&err_1);
                goto LAB_003a3ec5;
              }
              if ((0 < lVar8) &&
                 (CVar7 = curl_easy_setopt(curl,CURLOPT_TIMEOUT,lVar8), CVar7 != CURLE_OK)) {
                std::__cxx11::string::string
                          ((string *)&err_1,"DOWNLOAD cannot set timeout: ",(allocator *)&helper);
                curl_easy_strerror(CVar7);
                std::__cxx11::string::append((char *)&err_1);
                cmCommand::SetError(&this->super_cmCommand,&err_1);
                goto LAB_003a3ec5;
              }
              if (0 < local_520) {
                curl_easy_setopt(curl,CURLOPT_LOW_SPEED_LIMIT,1);
                curl_easy_setopt(curl,CURLOPT_LOW_SPEED_TIME,local_520);
              }
              anon_unknown.dwarf_660bbe::cURLProgressHelper::cURLProgressHelper
                        (&helper,this,"download");
              if (bVar6) {
                CVar7 = curl_easy_setopt(curl,CURLOPT_NOPROGRESS,0);
                if (CVar7 == CURLE_OK) {
                  CVar7 = curl_easy_setopt(curl,CURLOPT_PROGRESSFUNCTION,
                                           anon_unknown.dwarf_660bbe::cmFileDownloadProgressCallback
                                          );
                  if (CVar7 == CURLE_OK) {
                    CVar7 = curl_easy_setopt(curl,CURLOPT_PROGRESSDATA,&helper);
                    if (CVar7 == CURLE_OK) goto LAB_003a4127;
                    std::__cxx11::string::string
                              ((string *)&err_1,"DOWNLOAD cannot set progress data: ",
                               (allocator *)&actualHash_1);
                    curl_easy_strerror(CVar7);
                    std::__cxx11::string::append((char *)&err_1);
                    cmCommand::SetError(&this->super_cmCommand,&err_1);
                  }
                  else {
                    std::__cxx11::string::string
                              ((string *)&err_1,"DOWNLOAD cannot set progress function: ",
                               (allocator *)&actualHash_1);
                    curl_easy_strerror(CVar7);
                    std::__cxx11::string::append((char *)&err_1);
                    cmCommand::SetError(&this->super_cmCommand,&err_1);
                  }
                }
                else {
                  std::__cxx11::string::string
                            ((string *)&err_1,"DOWNLOAD cannot set noprogress value: ",
                             (allocator *)&actualHash_1);
                  curl_easy_strerror(CVar7);
                  std::__cxx11::string::append((char *)&err_1);
                  cmCommand::SetError(&this->super_cmCommand,&err_1);
                }
                this_00 = &err_1;
LAB_003a43e8:
                std::__cxx11::string::~string((string *)this_00);
                bVar6 = false;
              }
              else {
LAB_003a4127:
                CVar7 = curl_easy_perform(curl);
                g_curl.Easy = (CURL *)0x0;
                curl_easy_cleanup(curl);
                if (statusVar._M_string_length != 0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&err_1);
                  poVar10 = (ostream *)std::ostream::operator<<(&err_1,CVar7);
                  poVar10 = std::operator<<(poVar10,";\"");
                  pcVar11 = curl_easy_strerror(CVar7);
                  poVar10 = std::operator<<(poVar10,pcVar11);
                  std::operator<<(poVar10,"\"");
                  pcVar1 = (this->super_cmCommand).Makefile;
                  std::__cxx11::stringbuf::str();
                  cmMakefile::AddDefinition(pcVar1,&statusVar,actualHash_1._M_dataplus._M_p);
                  std::__cxx11::string::~string((string *)&actualHash_1);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err_1);
                }
                curl_global_cleanup();
                std::ostream::flush();
                std::ofstream::close();
                if (local_558 != (cmCryptoHash *)0x0) {
                  cmCryptoHash::HashFile(&actualHash_1,local_558,&file);
                  if (actualHash_1._M_string_length == 0) {
                    std::__cxx11::string::string
                              ((string *)&err_1,"DOWNLOAD cannot compute hash on downloaded file",
                               (allocator *)&local_290);
                    cmCommand::SetError(&this->super_cmCommand,&err_1);
                    std::__cxx11::string::~string((string *)&err_1);
                  }
                  else {
                    bVar6 = std::operator!=(&expectedHash,&actualHash_1);
                    if (!bVar6) {
                      std::__cxx11::string::~string((string *)&actualHash_1);
                      goto LAB_003a43fb;
                    }
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&err_1);
                    poVar10 = std::operator<<((ostream *)&err_1,"DOWNLOAD HASH mismatch");
                    poVar10 = std::endl<char,std::char_traits<char>>(poVar10);
                    poVar10 = std::operator<<(poVar10,"  for file: [");
                    poVar10 = std::operator<<(poVar10,(string *)&file);
                    poVar10 = std::operator<<(poVar10,"]");
                    poVar10 = std::endl<char,std::char_traits<char>>(poVar10);
                    poVar10 = std::operator<<(poVar10,"    expected hash: [");
                    poVar10 = std::operator<<(poVar10,(string *)&expectedHash);
                    poVar10 = std::operator<<(poVar10,"]");
                    poVar10 = std::endl<char,std::char_traits<char>>(poVar10);
                    poVar10 = std::operator<<(poVar10,"      actual hash: [");
                    poVar10 = std::operator<<(poVar10,(string *)&actualHash_1);
                    poVar10 = std::operator<<(poVar10,"]");
                    poVar10 = std::endl<char,std::char_traits<char>>(poVar10);
                    poVar10 = std::operator<<(poVar10,"           status: [");
                    poVar10 = (ostream *)std::ostream::operator<<(poVar10,CVar7);
                    poVar10 = std::operator<<(poVar10,";\"");
                    pcVar11 = curl_easy_strerror(CVar7);
                    poVar10 = std::operator<<(poVar10,pcVar11);
                    poVar10 = std::operator<<(poVar10,"\"]");
                    std::endl<char,std::char_traits<char>>(poVar10);
                    std::__cxx11::stringbuf::str();
                    cmCommand::SetError(&this->super_cmCommand,&local_290);
                    std::__cxx11::string::~string((string *)&local_290);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err_1);
                  }
                  this_00 = &actualHash_1;
                  goto LAB_003a43e8;
                }
LAB_003a43fb:
                bVar6 = true;
                if (logVar._M_string_length != 0) {
                  err_1._M_dataplus._M_p = err_1._M_dataplus._M_p & 0xffffffffffffff00;
                  std::vector<char,_std::allocator<char>_>::emplace_back<char>
                            (&chunkDebug,(char *)&err_1);
                  cmMakefile::AddDefinition
                            ((this->super_cmCommand).Makefile,&logVar,
                             chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
                }
              }
              std::__cxx11::string::~string((string *)&helper.Text);
            }
            else {
              std::__cxx11::string::string
                        ((string *)&err_1,"DOWNLOAD cannot set write data: ",(allocator *)&helper);
              curl_easy_strerror(CVar7);
              std::__cxx11::string::append((char *)&err_1);
              cmCommand::SetError(&this->super_cmCommand,&err_1);
LAB_003a3ec5:
              std::__cxx11::string::~string((string *)&err_1);
              bVar6 = false;
            }
            std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                      (&chunkDebug.super__Vector_base<char,_std::allocator<char>_>);
          }
          else {
            cmCommand::SetError(&this->super_cmCommand,&local_270);
            bVar6 = false;
          }
          std::__cxx11::string::~string((string *)&local_270);
        }
        else {
          std::__cxx11::string::string
                    ((string *)&err_1,"DOWNLOAD cannot set url: ",(allocator *)&helper);
          curl_easy_strerror(CVar7);
          std::__cxx11::string::append((char *)&err_1);
          cmCommand::SetError(&this->super_cmCommand,&err_1);
LAB_003a3b81:
          std::__cxx11::string::~string((string *)&err_1);
          bVar6 = false;
        }
        anon_unknown.dwarf_660bbe::cURLEasyGuard::~cURLEasyGuard(&g_curl);
      }
      else {
        std::__cxx11::string::string
                  ((string *)&err_1,"DOWNLOAD cannot open file for write.",(allocator *)&helper);
        cmCommand::SetError(&this->super_cmCommand,&err_1);
LAB_003a3795:
        std::__cxx11::string::~string((string *)&err_1);
        bVar6 = false;
      }
      std::ofstream::~ofstream(&fout);
    }
    else {
      std::operator+(&err_1,"DOWNLOAD error: cannot create directory \'",&dir);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                     &err_1,
                     "\' - Specify file by full path name and verify that you have directory creation and file write privileges."
                    );
      std::__cxx11::string::~string((string *)&err_1);
      cmCommand::SetError(&this->super_cmCommand,(string *)&fout);
      std::__cxx11::string::~string((string *)&fout);
      bVar6 = false;
    }
    std::__cxx11::string::~string((string *)&dir);
LAB_003a3bb4:
    if (local_558 == (cmCryptoHash *)0x0) goto LAB_003a3bc4;
  }
  (*local_558->_vptr_cmCryptoHash[1])();
LAB_003a3bc4:
  std::__cxx11::string::~string((string *)&hashMatchMSG);
  std::__cxx11::string::~string((string *)&expectedHash);
  std::__cxx11::string::~string((string *)&statusVar);
  std::__cxx11::string::~string((string *)&logVar);
  std::__cxx11::string::~string((string *)&file);
  std::__cxx11::string::~string((string *)&url);
  return bVar6;
}

Assistant:

bool
cmFileCommand::HandleDownloadCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  std::vector<std::string>::const_iterator i = args.begin();
  if(args.size() < 3)
    {
    this->SetError("DOWNLOAD must be called with at least three arguments.");
    return false;
    }
  ++i; // Get rid of subcommand
  std::string url = *i;
  ++i;
  std::string file = *i;
  ++i;

  long timeout = 0;
  long inactivity_timeout = 0;
  std::string logVar;
  std::string statusVar;
  bool tls_verify = this->Makefile->IsOn("CMAKE_TLS_VERIFY");
  const char* cainfo = this->Makefile->GetDefinition("CMAKE_TLS_CAINFO");
  std::string expectedHash;
  std::string hashMatchMSG;
  cmsys::auto_ptr<cmCryptoHash> hash;
  bool showProgress = false;

  while(i != args.end())
    {
    if(*i == "TIMEOUT")
      {
      ++i;
      if(i != args.end())
        {
        timeout = atol(i->c_str());
        }
      else
        {
        this->SetError("DOWNLOAD missing time for TIMEOUT.");
        return false;
        }
      }
    else if(*i == "INACTIVITY_TIMEOUT")
      {
      ++i;
      if(i != args.end())
        {
        inactivity_timeout = atol(i->c_str());
        }
      else
        {
        this->SetError("DOWNLOAD missing time for INACTIVITY_TIMEOUT.");
        return false;
        }
      }
    else if(*i == "LOG")
      {
      ++i;
      if( i == args.end())
        {
        this->SetError("DOWNLOAD missing VAR for LOG.");
        return false;
        }
      logVar = *i;
      }
    else if(*i == "STATUS")
      {
      ++i;
      if( i == args.end())
        {
        this->SetError("DOWNLOAD missing VAR for STATUS.");
        return false;
        }
      statusVar = *i;
      }
    else if(*i == "TLS_VERIFY")
      {
      ++i;
      if(i != args.end())
        {
        tls_verify = cmSystemTools::IsOn(i->c_str());
        }
      else
        {
        this->SetError("TLS_VERIFY missing bool value.");
        return false;
        }
      }
    else if(*i == "TLS_CAINFO")
      {
      ++i;
      if(i != args.end())
        {
        cainfo = i->c_str();
        }
      else
        {
        this->SetError("TLS_CAFILE missing file value.");
        return false;
        }
      }
    else if(*i == "EXPECTED_MD5")
      {
      ++i;
      if( i == args.end())
        {
        this->SetError("DOWNLOAD missing sum value for EXPECTED_MD5.");
        return false;
        }
      hash = cmsys::auto_ptr<cmCryptoHash>(cmCryptoHash::New("MD5"));
      hashMatchMSG = "MD5 sum";
      expectedHash = cmSystemTools::LowerCase(*i);
      }
    else if(*i == "SHOW_PROGRESS")
      {
      showProgress = true;
      }
    else if(*i == "EXPECTED_HASH")
      {
      ++i;
      if(i == args.end())
        {
        this->SetError("DOWNLOAD missing ALGO=value for EXPECTED_HASH.");
        return false;
        }
      std::string::size_type pos = i->find("=");
      if(pos == std::string::npos)
        {
        std::string err =
          "DOWNLOAD EXPECTED_HASH expects ALGO=value but got: ";
        err += *i;
        this->SetError(err);
        return false;
        }
      std::string algo = i->substr(0, pos);
      expectedHash = cmSystemTools::LowerCase(i->substr(pos+1));
      hash = cmsys::auto_ptr<cmCryptoHash>(cmCryptoHash::New(algo.c_str()));
      if(!hash.get())
        {
        std::string err = "DOWNLOAD EXPECTED_HASH given unknown ALGO: ";
        err += algo;
        this->SetError(err);
        return false;
        }
      hashMatchMSG = algo + " hash";
      }
    ++i;
    }
  // If file exists already, and caller specified an expected md5 or sha,
  // and the existing file already has the expected hash, then simply
  // return.
  //
  if(cmSystemTools::FileExists(file.c_str()) && hash.get())
    {
    std::string msg;
    std::string actualHash = hash->HashFile(file);
    if(actualHash == expectedHash)
      {
      msg = "returning early; file already exists with expected ";
      msg += hashMatchMSG;
      msg += "\"";
      if(!statusVar.empty())
        {
        std::ostringstream result;
        result << (int)0 << ";\"" << msg;
        this->Makefile->AddDefinition(statusVar,
                                      result.str().c_str());
        }
      return true;
      }
    }
  // Make sure parent directory exists so we can write to the file
  // as we receive downloaded bits from curl...
  //
  std::string dir = cmSystemTools::GetFilenamePath(file);
  if(!cmSystemTools::FileExists(dir.c_str()) &&
     !cmSystemTools::MakeDirectory(dir.c_str()))
    {
    std::string errstring = "DOWNLOAD error: cannot create directory '"
      + dir + "' - Specify file by full path name and verify that you "
      "have directory creation and file write privileges.";
    this->SetError(errstring);
    return false;
    }

  cmsys::ofstream fout(file.c_str(), std::ios::binary);
  if(!fout)
    {
    this->SetError("DOWNLOAD cannot open file for write.");
    return false;
    }

#if defined(_WIN32) && defined(CMAKE_ENCODING_UTF8)
  url = fix_file_url_windows(url);
#endif

  ::CURL *curl;
  ::curl_global_init(CURL_GLOBAL_DEFAULT);
  curl = ::curl_easy_init();
  if(!curl)
    {
    this->SetError("DOWNLOAD error initializing curl.");
    return false;
    }

  cURLEasyGuard g_curl(curl);
  ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
  check_curl_result(res, "DOWNLOAD cannot set url: ");

  // enable HTTP ERROR parsing
  res = ::curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
  check_curl_result(res, "DOWNLOAD cannot set http failure option: ");

  res = ::curl_easy_setopt(curl, CURLOPT_USERAGENT, "curl/" LIBCURL_VERSION);
  check_curl_result(res, "DOWNLOAD cannot set user agent option: ");

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION,
                           cmWriteToFileCallback);
  check_curl_result(res, "DOWNLOAD cannot set write function: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                           cmFileCommandCurlDebugCallback);
  check_curl_result(res, "DOWNLOAD cannot set debug function: ");

  // check to see if TLS verification is requested
  if(tls_verify)
    {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 1);
    check_curl_result(res, "Unable to set TLS/SSL Verify on: ");
    }
  else
    {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 0);
    check_curl_result(res, "Unable to set TLS/SSL Verify off: ");
    }
  // check to see if a CAINFO file has been specified
  // command arg comes first
  std::string const& cainfo_err = cmCurlSetCAInfo(curl, cainfo);
  if (!cainfo_err.empty())
    {
    this->SetError(cainfo_err);
    return false;
    }

  cmFileCommandVectorOfChar chunkDebug;

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEDATA, (void *)&fout);
  check_curl_result(res, "DOWNLOAD cannot set write data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, (void *)&chunkDebug);
  check_curl_result(res, "DOWNLOAD cannot set debug data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
  check_curl_result(res, "DOWNLOAD cannot set follow-redirect option: ");

  if(!logVar.empty())
    {
    res = ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);
    check_curl_result(res, "DOWNLOAD cannot set verbose: ");
    }

  if(timeout > 0)
    {
    res = ::curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout );
    check_curl_result(res, "DOWNLOAD cannot set timeout: ");
    }

  if(inactivity_timeout > 0)
    {
    // Give up if there is no progress for a long time.
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, inactivity_timeout);
    }

  // Need the progress helper's scope to last through the duration of
  // the curl_easy_perform call... so this object is declared at function
  // scope intentionally, rather than inside the "if(showProgress)"
  // block...
  //
  cURLProgressHelper helper(this, "download");

  if(showProgress)
    {
    res = ::curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0);
    check_curl_result(res, "DOWNLOAD cannot set noprogress value: ");

    res = ::curl_easy_setopt(curl,
      CURLOPT_PROGRESSFUNCTION, cmFileDownloadProgressCallback);
    check_curl_result(res, "DOWNLOAD cannot set progress function: ");

    res = ::curl_easy_setopt(curl,
      CURLOPT_PROGRESSDATA, reinterpret_cast<void*>(&helper));
    check_curl_result(res, "DOWNLOAD cannot set progress data: ");
    }

  res = ::curl_easy_perform(curl);

  /* always cleanup */
  g_curl.release();
  ::curl_easy_cleanup(curl);

  if(!statusVar.empty())
    {
    std::ostringstream result;
    result << (int)res << ";\"" << ::curl_easy_strerror(res) << "\"";
    this->Makefile->AddDefinition(statusVar,
                                  result.str().c_str());
    }

  ::curl_global_cleanup();

  // Explicitly flush/close so we can measure the md5 accurately.
  //
  fout.flush();
  fout.close();

  // Verify MD5 sum if requested:
  //
  if (hash.get())
    {
    std::string actualHash = hash->HashFile(file);
    if (actualHash.empty())
      {
      this->SetError("DOWNLOAD cannot compute hash on downloaded file");
      return false;
      }

    if (expectedHash != actualHash)
      {
      std::ostringstream oss;
      oss << "DOWNLOAD HASH mismatch" << std::endl
        << "  for file: [" << file << "]" << std::endl
        << "    expected hash: [" << expectedHash << "]" << std::endl
        << "      actual hash: [" << actualHash << "]" << std::endl
        << "           status: [" << (int)res << ";\""
          << ::curl_easy_strerror(res) << "\"]" << std::endl
        ;
      this->SetError(oss.str());
      return false;
      }
    }

  if (!logVar.empty())
    {
    chunkDebug.push_back(0);
    this->Makefile->AddDefinition(logVar, &*chunkDebug.begin());
    }

  return true;
#else
  this->SetError("DOWNLOAD not supported by bootstrap cmake.");
  return false;
#endif
}